

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

bool __thiscall MlmWrap::init_hardware_connection(MlmWrap *this)

{
  string *psVar1;
  mutex *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  network_pimpl *pnVar5;
  uint __val;
  uint uVar6;
  _Bool _Var7;
  int iVar8;
  int iVar9;
  zsock_t *pzVar10;
  ostream *poVar11;
  undefined8 *puVar12;
  long *plVar13;
  char *pcVar14;
  undefined8 uVar15;
  uint uVar16;
  size_type *psVar17;
  ulong uVar18;
  _Alloc_hider _Var19;
  uint uVar20;
  uint __len;
  string h_address;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_190;
  string local_170;
  ulong *local_150;
  long local_148;
  ulong local_140 [2];
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->hardwaresock != (zsock_t *)0x0) && (_Var7 = zsock_is(this->hardwaresock), _Var7)) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Hardware socket already initialized!\n","");
    error(&local_190,this,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_190._M_dataplus._M_p,local_190._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    _Var19._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return false;
    }
LAB_0021a213:
    operator_delete(_Var19._M_p,local_70.field_2._M_allocated_capacity + 1);
    return false;
  }
  paVar2 = &local_190.field_2;
  pcVar4 = (this->state->hardware_endpoint)._M_dataplus._M_p;
  local_190._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar4,pcVar4 + (this->state->hardware_endpoint)._M_string_length)
  ;
  if (local_190._M_string_length == 0) {
    iVar8 = std::__cxx11::string::compare((char *)&this->id);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if (iVar8 != 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Hardware socket not initialized by Trodes yet\n","");
      error(&local_190,this,&local_70);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,local_190._M_dataplus._M_p,local_190._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      _Var19._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return false;
      }
      goto LAB_0021a213;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &this->id;
  iVar8 = std::__cxx11::string::compare((char *)psVar1);
  if ((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)psVar1), iVar8 == 0)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Error initializing hardware connection. ","");
    error(&local_190,this,&local_90);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_190._M_dataplus._M_p,local_190._M_string_length
                        );
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(this->id)._M_dataplus._M_p,(this->id)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," cannot speak to hardware!\n",0x1b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_70.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
    _Var19._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return false;
    }
    goto LAB_0021a213;
  }
  iVar8 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar8 != 0) {
    pzVar10 = zsock_new_checked(3,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/networkincludes.cpp"
                                ,0x4e1);
    this->hardwaresock = pzVar10;
    zsock_set_identity(pzVar10,(this->id)._M_dataplus._M_p);
    pzVar10 = this->hardwaresock;
    pcVar4 = (this->state->hardware_endpoint)._M_dataplus._M_p;
    local_190._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,pcVar4,
               pcVar4 + (this->state->hardware_endpoint)._M_string_length);
    zsock_connect(pzVar10,"%s",local_190._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if (this->hardwaresock != (zsock_t *)0x0) {
      return true;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Error creating hardware router socket at ","");
    error(&local_190,this,&local_f0);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_190._M_dataplus._M_p,local_190._M_string_length
                        );
    pcVar4 = (this->state->hardware_endpoint)._M_dataplus._M_p;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar4,
               pcVar4 + (this->state->hardware_endpoint)._M_string_length);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_70.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
    _Var19._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
      return false;
    }
    goto LAB_0021a213;
  }
  pzVar10 = zsock_new_checked(6,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/networkincludes.cpp"
                              ,0x4c9);
  this->hardwaresock = pzVar10;
  if (pzVar10 == (zsock_t *)0x0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Error creating hardware router socket\n","");
    error(&local_190,this,&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_190._M_dataplus._M_p,local_190._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_70.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    _Var19._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return false;
    }
    goto LAB_0021a213;
  }
  pcVar4 = (this->state->address)._M_dataplus._M_p;
  local_190._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar4,pcVar4 + (this->state->address)._M_string_length);
  pzVar10 = this->hardwaresock;
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_190._M_dataplus._M_p,
             local_190._M_dataplus._M_p + local_190._M_string_length);
  std::__cxx11::string::append((char *)&local_150);
  uVar20 = this->state->port + 1;
  __val = -uVar20;
  if (0 < (int)uVar20) {
    __val = uVar20;
  }
  __len = 1;
  if (9 < __val) {
    uVar18 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar16 = (uint)uVar18;
      if (uVar16 < 100) {
        __len = __len - 2;
        goto LAB_0021a39e;
      }
      if (uVar16 < 1000) {
        __len = __len - 1;
        goto LAB_0021a39e;
      }
      if (uVar16 < 10000) goto LAB_0021a39e;
      uVar18 = uVar18 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar16);
    __len = __len + 1;
  }
LAB_0021a39e:
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,(char)__len - (char)((int)uVar20 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar20 >> 0x1f) + (long)local_130),__len,__val);
  uVar18 = 0xf;
  if (local_150 != local_140) {
    uVar18 = local_140[0];
  }
  if (uVar18 < (ulong)(local_128 + local_148)) {
    uVar18 = 0xf;
    if (local_130 != local_120) {
      uVar18 = local_120[0];
    }
    if ((ulong)(local_128 + local_148) <= uVar18) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_150);
      goto LAB_0021a436;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130);
LAB_0021a436:
  local_110 = &local_100;
  plVar13 = puVar12 + 2;
  if ((long *)*puVar12 == plVar13) {
    local_100 = *plVar13;
    uStack_f8 = puVar12[3];
  }
  else {
    local_100 = *plVar13;
    local_110 = (long *)*puVar12;
  }
  local_108 = puVar12[1];
  *puVar12 = plVar13;
  puVar12[1] = 0;
  *(undefined1 *)plVar13 = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_110);
  paVar3 = &local_170.field_2;
  psVar17 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_170.field_2._M_allocated_capacity = *psVar17;
    local_170.field_2._8_4_ = (undefined4)plVar13[3];
    local_170.field_2._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
    local_170._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar17;
    local_170._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_170._M_string_length = plVar13[1];
  *plVar13 = (long)psVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  iVar8 = zsock_bind(pzVar10,"%s",local_170._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar3) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  if (iVar8 < 0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Error initializing Trodes hardware socket\n","");
    error(&local_170,this,&local_d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_170._M_dataplus._M_p,local_170._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar3) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->state->hardware_address);
    pnVar5 = this->state;
    pnVar5->hardware_port = iVar8;
    pcVar14 = zsock_endpoint(this->hardwaresock);
    std::__cxx11::string::string((string *)&local_170,pcVar14,(allocator *)&local_110);
    std::__cxx11::string::_M_assign((string *)&pnVar5->hardware_endpoint);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar3) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    __mutex = &this->actormutex;
    iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar9 != 0) {
      uVar15 = std::__throw_system_error(iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar3) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((mutex *)local_d0._M_dataplus._M_p != __mutex) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar15);
    }
    zstr_send(this->actor,"addhsock");
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (iVar8 < 0) {
    return false;
  }
  return true;
}

Assistant:

bool MlmWrap::init_hardware_connection(){
    if(hardwaresock != NULL && zsock_is(hardwaresock)){
        std::cerr << error("Hardware socket already initialized!\n");
        return false;
    }

    if(state->getHardware_endpoint().empty() && id != TRODES_NETWORK_ID){
        std::cerr << error("Hardware socket not initialized by Trodes yet\n");
        return false;
    }

    if(id == TEMP_NETWORK_ID || id == BROKER_NETWORK_ID){
        std::cerr << error("Error initializing hardware connection. ") << id << " cannot speak to hardware!\n";
        return false;
    }

    if(id == TRODES_NETWORK_ID){
    //1. create socket
        hardwaresock = zsock_new(ZMQ_ROUTER);
        if(hardwaresock == NULL){
            std::cerr << error("Error creating hardware router socket\n");
            return false;
        }
        std::string h_address = state->getAddress();
        int h_port = zsock_bind(hardwaresock, "%s", std::string(h_address + ":*[" +
                       std::to_string(state->getPort()+1) + "-]").c_str());
        if(h_port < 0){
            std::cerr << error("Error initializing Trodes hardware socket\n");
            return false;
        }

    //2. update state
        state->setHardware_address(h_address);
        state->setHardware_port(h_port);
        state->setHardware_endpoint(zsock_endpoint(hardwaresock));

    //3. add hardwaresock to zloop so that it can be handled automatically
        std::lock_guard<std::mutex> lock(actormutex);
        zstr_send(actor, addhsock);
    }
    else{
    //1. use the trodes hardware router socket address and connect (get from hardware state)
        hardwaresock = zsock_new(ZMQ_REQ);
        zsock_set_identity(hardwaresock, id.c_str());
        zsock_connect(hardwaresock, "%s", state->getHardware_endpoint().c_str());
        if(hardwaresock == NULL){
            std::cerr << error("Error creating hardware router socket at ") << state->getHardware_endpoint() << "\n";
            return false;
        }
    }
    return true;
}